

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

string * gl3cts::TransformFeedback::Utilities::preprocessCode
                   (string *__return_storage_ptr__,string *source,string *key,string *value)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)key);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,(string *)key->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string gl3cts::TransformFeedback::Utilities::preprocessCode(std::string source, std::string key, std::string value)
{
	std::string destination = source;

	while (true)
	{
		/* Find token in source code. */
		size_t position = destination.find(key, 0);

		/* No more occurences of this key. */
		if (position == std::string::npos)
		{
			break;
		}

		/* Replace token with sub_code. */
		destination.replace(position, key.size(), value);
	}

	return destination;
}